

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
FunctionMockerBase(FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>
                   *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_002b8230;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>,_false>.
  _M_head_impl.super_MatcherBase<TestExprBuilder<5,_BasicTestExpr<1>_>_>.impl_.value_ =
       (MatcherInterface<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->current_spec_).matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>,_false>.
          _M_head_impl.super_MatcherBase<TestExprBuilder<5,_BasicTestExpr<1>_>_>.impl_ + 8))->next_
       = (linked_ptr_internal *)
         ((long)&(this->current_spec_).matchers_.
                 super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>_>.
                 super__Head_base<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>,_false>
                 ._M_head_impl.super_MatcherBase<TestExprBuilder<5,_BasicTestExpr<1>_>_>.impl_ + 8);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>,_false>.
  _M_head_impl.super_MatcherBase<TestExprBuilder<5,_BasicTestExpr<1>_>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002b2fa8;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}